

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_max>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  __m256 afVar1;
  undefined1 auVar2 [16];
  long *in_RDX;
  long *in_RSI;
  binary_op_max *this;
  long *in_RDI;
  bool bVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  __m128 afVar9;
  __m128 _outp_1;
  __m128 _p1_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _p1;
  __m256 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_max op;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  __m256 *in_stack_fffffffffffffae0;
  binary_op_max *this_00;
  Allocator *in_stack_fffffffffffffaf8;
  Mat *in_stack_fffffffffffffb00;
  Mat *in_stack_fffffffffffffb08;
  float local_480 [2];
  float afStack_478 [2];
  float local_470 [2];
  float afStack_468 [2];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  int local_3e4;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined4 local_3c8;
  long local_3c0;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 local_3a8;
  undefined8 local_3a0;
  binary_op_max *local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined4 local_378;
  long local_370;
  undefined4 local_368;
  undefined4 local_364;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined8 local_350;
  float *local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined4 local_328;
  long local_320;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 local_308;
  undefined8 local_300;
  float *local_2f8;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  binary_op_max local_2d1 [9];
  long *local_2c8;
  long *local_2c0;
  long *local_2b8;
  int local_2ac;
  long *local_2a8;
  undefined1 local_29d;
  int local_29c;
  undefined8 *local_290;
  undefined1 local_285;
  int local_284;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_250;
  undefined8 *local_248;
  binary_op_max *local_240;
  undefined1 local_235;
  int local_234;
  undefined8 *local_228;
  undefined8 *local_218;
  float *local_210;
  float *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  binary_op_max *local_1d8;
  float *local_1d0;
  float *local_1c8;
  undefined8 local_1c0;
  float afStack_1b8 [4];
  binary_op_max *local_1a8;
  long *local_1a0;
  long local_198;
  undefined4 local_18c;
  long local_188;
  binary_op_max *local_180;
  undefined4 local_174;
  int local_170;
  int local_16c;
  undefined8 *local_168;
  long local_160;
  undefined4 local_154;
  long local_150;
  float *local_148;
  undefined4 local_13c;
  int local_138;
  int local_134;
  undefined8 *local_130;
  long local_128;
  undefined4 local_11c;
  long local_118;
  float *local_110;
  undefined4 local_104;
  int local_100;
  int local_fc;
  undefined8 *local_f8;
  undefined4 local_ec;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  binary_op_max *local_a8;
  undefined8 *local_98;
  undefined8 *local_88;
  
  local_2d8 = *(int *)((long)in_RDI + 0x2c);
  local_2dc = (int)in_RDI[6];
  local_2e0 = *(int *)((long)in_RDI + 0x34);
  local_2e4 = (int)in_RDI[7];
  local_2e8 = (int)in_RDI[3];
  local_2ec = local_2d8 * local_2dc * local_2e0 * local_2e8;
  local_2c8 = in_RDX;
  local_2c0 = in_RSI;
  local_2b8 = in_RDI;
  Mat::create_like(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  local_2a8 = local_2c8;
  bVar3 = true;
  if (*local_2c8 != 0) {
    local_1a0 = local_2c8;
    bVar3 = local_2c8[8] * (long)(int)local_2c8[7] == 0;
  }
  if (bVar3) {
    local_2ac = -100;
  }
  else {
    for (local_2f0 = 0; local_2f0 < local_2e4; local_2f0 = local_2f0 + 1) {
      local_278 = &local_340;
      local_134 = *(int *)((long)local_2b8 + 0x2c);
      local_138 = (int)local_2b8[6];
      local_13c = *(undefined4 *)((long)local_2b8 + 0x34);
      local_2f8 = (float *)(*local_2b8 + local_2b8[8] * (long)local_2f0 * local_2b8[2]);
      local_150 = local_2b8[2];
      local_154 = (undefined4)local_2b8[3];
      local_160 = local_2b8[4];
      local_130 = &local_340;
      local_d8 = (long)local_134 * (long)local_138 * local_150;
      local_268 = &local_340;
      local_250 = &local_340;
      local_290 = &local_390;
      local_fc = *(int *)((long)local_2c0 + 0x2c);
      local_100 = (int)local_2c0[6];
      local_104 = *(undefined4 *)((long)local_2c0 + 0x34);
      local_348 = (float *)(*local_2c0 + local_2c0[8] * (long)local_2f0 * local_2c0[2]);
      local_118 = local_2c0[2];
      local_11c = (undefined4)local_2c0[3];
      local_128 = local_2c0[4];
      local_f8 = &local_390;
      local_e8 = (long)local_fc * (long)local_100 * local_118;
      local_270 = &local_390;
      local_248 = &local_390;
      local_228 = &local_3e0;
      local_16c = *(int *)((long)local_2c8 + 0x2c);
      local_170 = (int)local_2c8[6];
      local_174 = *(undefined4 *)((long)local_2c8 + 0x34);
      this = (binary_op_max *)(*local_2c8 + local_2c8[8] * (long)local_2f0 * local_2c8[2]);
      local_188 = local_2c8[2];
      local_18c = (undefined4)local_2c8[3];
      local_198 = local_2c8[4];
      local_168 = &local_3e0;
      local_c8 = (long)local_16c * (long)local_170 * local_188;
      local_218 = &local_3e0;
      this_00 = (binary_op_max *)&local_3e0;
      local_308 = 0;
      local_30c = 0;
      local_310 = 0;
      local_314 = 0;
      local_328 = 0;
      local_330 = 0;
      local_338 = 0;
      local_340 = 0;
      local_358 = 0;
      local_35c = 0;
      local_360 = 0;
      local_364 = 0;
      local_378 = 0;
      local_380 = 0;
      local_388 = 0;
      local_390 = 0;
      local_cc = 0x10;
      local_dc = 0x10;
      local_ec = 0x10;
      local_234 = local_2f0;
      local_235 = 1;
      local_284 = local_2f0;
      local_285 = 1;
      local_29c = local_2f0;
      local_29d = 1;
      local_300 = 0;
      local_318 = 0;
      local_350 = 0;
      local_368 = 0;
      local_3e0 = 0;
      local_3d0 = 0;
      local_3c8 = 0;
      local_3b8 = 0;
      local_3b4 = 0;
      local_3b0 = 0;
      local_3ac = 0;
      local_3a8 = 0;
      local_3a0 = 0;
      local_3d8 = 0;
      local_398 = this;
      local_240 = this_00;
      local_180 = this;
      local_148 = local_2f8;
      local_110 = local_348;
      local_a8 = this_00;
      local_98 = local_248;
      local_88 = local_250;
      local_3c0 = local_198;
      local_370 = local_128;
      local_320 = local_160;
      for (local_3e4 = 0; local_3e4 + 7 < local_2ec; local_3e4 = local_3e4 + 8) {
        local_208 = local_2f8;
        local_420 = *(undefined8 *)local_2f8;
        uStack_418 = *(undefined8 *)(local_2f8 + 2);
        uStack_410 = *(undefined8 *)(local_2f8 + 4);
        uStack_408 = *(undefined8 *)(local_2f8 + 6);
        local_210 = local_348;
        uVar6 = *(undefined8 *)local_348;
        uVar5 = *(undefined8 *)(local_348 + 2);
        uVar7 = *(undefined8 *)(local_348 + 4);
        uVar8 = *(undefined8 *)(local_348 + 6);
        local_440 = uVar6;
        uStack_438 = uVar5;
        uStack_430 = uVar7;
        uStack_428 = uVar8;
        BinaryOp_x86_avx_functor::binary_op_max::func_pack8
                  (this_00,(__m256 *)this,in_stack_fffffffffffffae0);
        local_1d8 = local_398;
        afVar1[2] = (float)(int)uVar5;
        afVar1[3] = (float)(int)((ulong)uVar5 >> 0x20);
        afVar1[0] = (float)(int)uVar6;
        afVar1[1] = (float)(int)((ulong)uVar6 >> 0x20);
        afVar1[4] = (float)(int)uVar7;
        afVar1[5] = (float)(int)((ulong)uVar7 >> 0x20);
        afVar1[6] = (float)(int)uVar8;
        afVar1[7] = (float)(int)((ulong)uVar8 >> 0x20);
        *(__m256 *)local_398 = afVar1;
        local_2f8 = local_2f8 + 8;
        local_348 = local_348 + 8;
        local_398 = local_398 + 0x20;
        local_460 = uVar6;
        uStack_458 = uVar5;
        uStack_450 = uVar7;
        uStack_448 = uVar8;
        local_200 = uVar6;
        uStack_1f8 = uVar5;
        uStack_1f0 = uVar7;
        uStack_1e8 = uVar8;
      }
      for (; local_3e4 + 3 < local_2ec; local_3e4 = local_3e4 + 4) {
        local_1c8 = local_2f8;
        local_470 = *(float (*) [2])local_2f8;
        afStack_468 = *(float (*) [2])(local_2f8 + 2);
        local_1d0 = local_348;
        local_480 = *(float (*) [2])local_348;
        uVar6 = *(undefined8 *)(local_348 + 2);
        afStack_478 = (float  [2])uVar6;
        afVar9 = BinaryOp_x86_avx_functor::binary_op_max::func_pack4
                           (local_2d1,(__m128 *)local_470,(__m128 *)local_480);
        local_1c0 = afVar9._0_8_;
        local_1a8 = local_398;
        auVar2._8_4_ = (float)uVar6;
        auVar2._12_4_ = SUB84(uVar6,4);
        auVar2._0_8_ = local_1c0;
        *(undefined1 (*) [16])local_398 = auVar2;
        local_2f8 = local_2f8 + 4;
        local_348 = local_348 + 4;
        local_398 = local_398 + 0x10;
        afStack_1b8._0_8_ = uVar6;
      }
      for (; local_3e4 < local_2ec; local_3e4 = local_3e4 + 1) {
        fVar4 = BinaryOp_x86_avx_functor::binary_op_max::func
                          (this,*in_stack_fffffffffffffae0,(float *)0x1732868);
        *(float *)local_398 = fVar4;
        local_2f8 = local_2f8 + 1;
        local_348 = local_348 + 1;
        local_398 = local_398 + 4;
      }
    }
    local_2ac = 0;
  }
  return local_2ac;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}